

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::SwapObjects(NULLCRef l,NULLCRef r)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 *__dest;
  ulong __n;
  FastVector<char,_false,_false> *pFVar4;
  char tmpStack [512];
  undefined1 auStack_228 [512];
  
  __dest = auStack_228;
  if (tmpStack._8_4_ != tmpStack._24_4_) {
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),tmpStack._24_4_
                       );
    pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),tmpStack._8_4_)
    ;
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    nullcThrowError("ERROR: types don\'t match (%s ref, %s ref)",pcVar2,pcVar3);
    return;
  }
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),tmpStack._8_4_);
  __n = (ulong)pEVar1->size;
  if (0x1ff < __n) {
    __dest = (undefined1 *)AllocObject(pEVar1->size,tmpStack._8_4_);
  }
  memcpy(__dest,(void *)tmpStack._12_8_,__n);
  memcpy((void *)tmpStack._12_8_,(void *)tmpStack._28_8_,__n);
  memcpy((void *)tmpStack._28_8_,__dest,__n);
  return;
}

Assistant:

void NULLC::SwapObjects(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: types don't match (%s ref, %s ref)", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return;
	}
	unsigned size = linker->exTypes[l.typeID].size;

	char tmpStack[512];
	// $$ should use some extendable static storage for big objects
	char *tmp = size < 512 ? tmpStack : (char*)NULLC::AllocObject(size, l.typeID);
	memcpy(tmp, l.ptr, size);
	memcpy(l.ptr, r.ptr, size);
	memcpy(r.ptr, tmp, size);
}